

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8_fp16.h
# Opt level: O1

void ncnn::convdw3x3s2_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  long lVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [32];
  uint uVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  undefined1 (*pauVar39) [32];
  undefined1 (*pauVar40) [32];
  undefined1 auVar41 [32];
  
  iVar5 = bottom_blob->c;
  if (0 < (long)iVar5) {
    uVar6 = top_blob->w;
    iVar7 = top_blob->h;
    pvVar8 = _bias->data;
    lVar37 = (long)(int)((bottom_blob->w - uVar6) * 0x10);
    lVar33 = 0;
    do {
      if (pvVar8 == (void *)0x0) {
        auVar41 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar41 = *(undefined1 (*) [32])((long)pvVar8 + lVar33 * 0x20);
      }
      pauVar39 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar33 * top_blob->elemsize + (long)top_blob->data);
      lVar28 = kernel->w * lVar33 * kernel->elemsize;
      pvVar9 = kernel->data;
      auVar10 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28));
      auVar11 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x10));
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x20));
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x30));
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x40));
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x50));
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x60));
      auVar17 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x70));
      auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar28 + 0x80));
      if (0 < iVar7) {
        auVar19 = vcvtph2ps_f16c(auVar10);
        auVar20 = vcvtph2ps_f16c(auVar11);
        auVar21 = vcvtph2ps_f16c(auVar12);
        auVar22 = vcvtph2ps_f16c(auVar13);
        auVar23 = vcvtph2ps_f16c(auVar14);
        auVar24 = vcvtph2ps_f16c(auVar15);
        auVar25 = vcvtph2ps_f16c(auVar16);
        auVar26 = vcvtph2ps_f16c(auVar17);
        auVar27 = vcvtph2ps_f16c(auVar18);
        pauVar40 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar33 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar28 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar30 = (undefined1 (*) [32])(*pauVar40 + lVar28 * 2);
        pauVar29 = (undefined1 (*) [32])(*pauVar40 + lVar28);
        iVar34 = 0;
        do {
          if ((int)uVar6 < 4) {
            uVar35 = 0;
          }
          else {
            iVar38 = 3;
            do {
              auVar10 = vfmadd213ps_fma(*pauVar40,auVar19,auVar41);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,pauVar40[1]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar21,pauVar40[2]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,*pauVar29);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,pauVar29[1]);
              auVar1 = pauVar40[4];
              auVar2 = pauVar29[4];
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar24,pauVar29[2]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar25,*pauVar30);
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar26,pauVar30[1]);
              auVar10 = vfmadd213ps_fma(pauVar40[2],auVar19,auVar41);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,pauVar40[3]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar21,auVar1);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,pauVar29[2]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,pauVar29[3]);
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar27,pauVar30[2]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar24,auVar2);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar25,pauVar30[2]);
              auVar3 = pauVar30[4];
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar26,pauVar30[3]);
              *pauVar39 = ZEXT1632(auVar11);
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar27,auVar3);
              auVar4 = pauVar40[6];
              auVar10 = vfmadd213ps_fma(auVar1,auVar19,auVar41);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,pauVar40[5]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar21,auVar4);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,auVar2);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,pauVar29[5]);
              auVar1 = pauVar29[6];
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar24,auVar1);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar25,auVar3);
              auVar2 = pauVar30[6];
              auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar26,pauVar30[5]);
              pauVar39[1] = ZEXT1632(auVar11);
              auVar10 = vfmadd213ps_fma(auVar4,auVar19,auVar41);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,pauVar40[7]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar21,pauVar40[8]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,auVar1);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,pauVar29[7]);
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar27,auVar2);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar24,pauVar29[8]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar25,auVar2);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar26,pauVar30[7]);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar27,pauVar30[8]);
              pauVar39[2] = ZEXT1632(auVar11);
              pauVar39[3] = ZEXT1632(auVar10);
              pauVar40 = pauVar40 + 8;
              pauVar29 = pauVar29 + 8;
              pauVar30 = pauVar30 + 8;
              pauVar39 = pauVar39 + 4;
              iVar38 = iVar38 + 4;
              uVar35 = uVar6 & 0xfffffffc;
            } while (iVar38 < (int)uVar6);
          }
          uVar31 = uVar35 | 1;
          while ((int)uVar31 < (int)uVar6) {
            auVar10 = vfmadd213ps_fma(*pauVar40,auVar19,auVar41);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,pauVar40[1]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar21,pauVar40[2]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,*pauVar29);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,pauVar29[1]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar24,pauVar29[2]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar25,*pauVar30);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar26,pauVar30[1]);
            auVar10 = vfmadd213ps_fma(pauVar40[2],auVar19,auVar41);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,pauVar40[3]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar21,pauVar40[4]);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar27,pauVar30[2]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,pauVar29[2]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,pauVar29[3]);
            pauVar40 = pauVar40 + 4;
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar24,pauVar29[4]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar25,pauVar30[2]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar26,pauVar30[3]);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar27,pauVar30[4]);
            pauVar29 = pauVar29 + 4;
            pauVar30 = pauVar30 + 4;
            *pauVar39 = ZEXT1632(auVar11);
            pauVar39[1] = ZEXT1632(auVar10);
            pauVar39 = pauVar39 + 2;
            uVar31 = uVar35 + 3;
            uVar35 = uVar35 + 2;
          }
          iVar38 = uVar6 - uVar35;
          if (iVar38 != 0 && (int)uVar35 <= (int)uVar6) {
            lVar36 = 0;
            lVar28 = 0;
            do {
              lVar32 = lVar28;
              auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])(*pauVar40 + lVar32 * 2),auVar19,
                                        auVar41);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,
                                        *(undefined1 (*) [32])(pauVar40[1] + lVar32 * 2));
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar21,
                                        *(undefined1 (*) [32])(pauVar40[2] + lVar32 * 2));
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,
                                        *(undefined1 (*) [32])(*pauVar29 + lVar32 * 2));
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,
                                        *(undefined1 (*) [32])(pauVar29[1] + lVar32 * 2));
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar24,
                                        *(undefined1 (*) [32])(pauVar29[2] + lVar32 * 2));
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar25,
                                        *(undefined1 (*) [32])(*pauVar30 + lVar32 * 2));
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar26,
                                        *(undefined1 (*) [32])(pauVar30[1] + lVar32 * 2));
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar27,
                                        *(undefined1 (*) [32])(pauVar30[2] + lVar32 * 2));
              *(undefined1 (*) [32])((long)*pauVar39 + lVar32) = ZEXT1632(auVar10);
              lVar36 = lVar36 + -0x40;
              iVar38 = iVar38 + -1;
              lVar28 = lVar32 + 0x20;
            } while (iVar38 != 0);
            pauVar39 = (undefined1 (*) [32])(pauVar39[1] + lVar32);
            pauVar40 = (undefined1 (*) [32])((long)pauVar40 - lVar36);
            pauVar29 = (undefined1 (*) [32])((long)pauVar29 - lVar36);
            pauVar30 = (undefined1 (*) [32])((long)pauVar30 - lVar36);
          }
          pauVar40 = (undefined1 (*) [32])(*pauVar40 + lVar37 * 4);
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + lVar37 * 4);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + lVar37 * 4);
          iVar34 = iVar34 + 1;
        } while (iVar34 != iVar7);
      }
      lVar33 = lVar33 + 1;
    } while (lVar33 != iVar5);
  }
  return;
}

Assistant:

static void convdw3x3s2_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const unsigned short* k0 = (const unsigned short*)kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = loadfp16(k0);
        __m256 _k01 = loadfp16(k0 + 8);
        __m256 _k02 = loadfp16(k0 + 16);
        __m256 _k10 = loadfp16(k0 + 24);
        __m256 _k11 = loadfp16(k0 + 32);
        __m256 _k12 = loadfp16(k0 + 40);
        __m256 _k20 = loadfp16(k0 + 48);
        __m256 _k21 = loadfp16(k0 + 56);
        __m256 _k22 = loadfp16(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r26, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm256_storeu_ps(outptr0, _sum0);
                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}